

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall
icu_63::Calendar::add(Calendar *this,UCalendarDateFields field,int32_t amount,UErrorCode *status)

{
  UCalendarWallTimeOption UVar1;
  UCalendarDateFields field_00;
  UBool UVar2;
  UBool UVar3;
  int iVar4;
  int32_t iVar5;
  int32_t iVar6;
  undefined4 extraout_var;
  double dVar7;
  UDate local_a0;
  int local_94;
  double dStack_68;
  UBool hasTransition;
  UDate immediatePrevTrans;
  UDate tmpT;
  int32_t adjAmount;
  int32_t newOffset;
  UDate t;
  int32_t newWallTime;
  int32_t prevWallTime;
  int32_t prevOffset;
  UBool oldLenient;
  char *calType;
  int32_t era;
  UBool keepWallTimeInvariant;
  double delta;
  UErrorCode *status_local;
  int32_t amount_local;
  UCalendarDateFields field_local;
  Calendar *this_local;
  
  if (amount == 0) {
    return;
  }
  _era = (double)amount;
  calType._7_1_ = '\x01';
  delta = (double)status;
  status_local._0_4_ = amount;
  status_local._4_4_ = field;
  _amount_local = this;
  switch(field) {
  case UCAL_ERA:
    iVar5 = get(this,field,status);
    set(this,field,iVar5 + (int)status_local);
    (*(this->super_UObject)._vptr_UObject[0x2c])(this,0,delta);
    return;
  case UCAL_YEAR:
  case UCAL_YEAR_WOY:
    calType._0_4_ = get(this,UCAL_ERA,status);
    if ((int32_t)calType == 0) {
      iVar4 = (*(this->super_UObject)._vptr_UObject[0x17])();
      _prevOffset = (char *)CONCAT44(extraout_var,iVar4);
      iVar4 = strcmp(_prevOffset,"gregorian");
      if (((iVar4 == 0) || (iVar4 = strcmp(_prevOffset,"roc"), iVar4 == 0)) ||
         (iVar4 = strcmp(_prevOffset,"coptic"), iVar4 == 0)) {
        status_local._0_4_ = -(int)status_local;
      }
    }
  case UCAL_MONTH:
  case UCAL_EXTENDED_YEAR:
    prevWallTime._3_1_ = isLenient(this);
    setLenient(this,'\x01');
    field_00 = status_local._4_4_;
    iVar5 = get(this,status_local._4_4_,(UErrorCode *)delta);
    set(this,field_00,iVar5 + (int)status_local);
    (*(this->super_UObject)._vptr_UObject[0x2c])(this,5,delta);
    if (prevWallTime._3_1_ != '\0') {
      return;
    }
    complete(this,(UErrorCode *)delta);
    setLenient(this,prevWallTime._3_1_);
    return;
  case UCAL_WEEK_OF_YEAR:
  case UCAL_WEEK_OF_MONTH:
  case UCAL_DAY_OF_WEEK_IN_MONTH:
    _era = _era * 604800000.0;
    break;
  case UCAL_DATE:
  case UCAL_DAY_OF_YEAR:
  case UCAL_DAY_OF_WEEK:
  case UCAL_DOW_LOCAL:
  case UCAL_JULIAN_DAY:
    _era = _era * 86400000.0;
    break;
  case UCAL_AM_PM:
    _era = _era * 43200000.0;
    break;
  case UCAL_HOUR:
  case UCAL_HOUR_OF_DAY:
    _era = _era * 3600000.0;
    calType._7_1_ = '\0';
    break;
  case UCAL_MINUTE:
    _era = _era * 60000.0;
    calType._7_1_ = '\0';
    break;
  case UCAL_SECOND:
    _era = _era * 1000.0;
    calType._7_1_ = '\0';
    break;
  case UCAL_MILLISECOND:
  case UCAL_MILLISECONDS_IN_DAY:
    calType._7_1_ = '\0';
    break;
  default:
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return;
  }
  newWallTime = 0;
  t._4_4_ = 0;
  if (calType._7_1_ != '\0') {
    iVar5 = get(this,UCAL_DST_OFFSET,status);
    iVar6 = get(this,UCAL_ZONE_OFFSET,(UErrorCode *)delta);
    newWallTime = iVar5 + iVar6;
    t._4_4_ = get(this,UCAL_MILLISECONDS_IN_DAY,(UErrorCode *)delta);
  }
  dVar7 = getTimeInMillis(this,(UErrorCode *)delta);
  setTimeInMillis(this,dVar7 + _era,(UErrorCode *)delta);
  if ((calType._7_1_ != '\0') &&
     (t._0_4_ = get(this,UCAL_MILLISECONDS_IN_DAY,(UErrorCode *)delta), t._0_4_ != t._4_4_)) {
    _adjAmount = internalGetTime(this);
    iVar5 = get(this,UCAL_DST_OFFSET,(UErrorCode *)delta);
    iVar6 = get(this,UCAL_ZONE_OFFSET,(UErrorCode *)delta);
    tmpT._4_4_ = iVar5 + iVar6;
    if (tmpT._4_4_ != newWallTime) {
      local_94 = newWallTime - tmpT._4_4_;
      if (local_94 < 0) {
        local_94 = -(-local_94 % 86400000);
      }
      else {
        local_94 = local_94 % 86400000;
      }
      tmpT._0_4_ = local_94;
      if (local_94 != 0) {
        setTimeInMillis(this,_adjAmount + (double)local_94,(UErrorCode *)delta);
        t._0_4_ = get(this,UCAL_MILLISECONDS_IN_DAY,(UErrorCode *)delta);
      }
      if (t._0_4_ != t._4_4_) {
        UVar1 = this->fSkippedWallTime;
        if (UVar1 == UCAL_WALLTIME_LAST) {
          if (tmpT._0_4_ < 0) {
            setTimeInMillis(this,_adjAmount,(UErrorCode *)delta);
          }
        }
        else if (UVar1 == UCAL_WALLTIME_FIRST) {
          if (0 < tmpT._0_4_) {
            setTimeInMillis(this,_adjAmount,(UErrorCode *)delta);
          }
        }
        else if (UVar1 == UCAL_WALLTIME_NEXT_VALID) {
          if (tmpT._0_4_ < 1) {
            local_a0 = _adjAmount;
          }
          else {
            local_a0 = internalGetTime(this);
          }
          immediatePrevTrans = local_a0;
          UVar2 = getImmediatePreviousZoneTransition
                            (this,local_a0,&stack0xffffffffffffff98,(UErrorCode *)delta);
          UVar3 = ::U_SUCCESS(*(UErrorCode *)delta);
          if ((UVar3 != '\0') && (UVar2 != '\0')) {
            setTimeInMillis(this,dStack_68,(UErrorCode *)delta);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Calendar::add(UCalendarDateFields field, int32_t amount, UErrorCode& status)
{
    if (amount == 0) {
        return;   // Do nothing!
    }

    // We handle most fields in the same way.  The algorithm is to add
    // a computed amount of millis to the current millis.  The only
    // wrinkle is with DST (and/or a change to the zone's UTC offset, which
    // we'll include with DST) -- for some fields, like the DAY_OF_MONTH,
    // we don't want the wall time to shift due to changes in DST.  If the
    // result of the add operation is to move from DST to Standard, or
    // vice versa, we need to adjust by an hour forward or back,
    // respectively.  For such fields we set keepWallTimeInvariant to TRUE.

    // We only adjust the DST for fields larger than an hour.  For
    // fields smaller than an hour, we cannot adjust for DST without
    // causing problems.  for instance, if you add one hour to April 5,
    // 1998, 1:00 AM, in PST, the time becomes "2:00 AM PDT" (an
    // illegal value), but then the adjustment sees the change and
    // compensates by subtracting an hour.  As a result the time
    // doesn't advance at all.

    // For some fields larger than a day, such as a UCAL_MONTH, we pin the
    // UCAL_DAY_OF_MONTH.  This allows <March 31>.add(UCAL_MONTH, 1) to be
    // <April 30>, rather than <April 31> => <May 1>.

    double delta = amount; // delta in ms
    UBool keepWallTimeInvariant = TRUE;

    switch (field) {
    case UCAL_ERA:
        set(field, get(field, status) + amount);
        pinField(UCAL_ERA, status);
        return;

    case UCAL_YEAR:
    case UCAL_YEAR_WOY:
      {
        // * If era=0 and years go backwards in time, change sign of amount.
        // * Until we have new API per #9393, we temporarily hardcode knowledge of
        //   which calendars have era 0 years that go backwards.
        // * Note that for UCAL_YEAR (but not UCAL_YEAR_WOY) we could instead handle
        //   this by applying the amount to the UCAL_EXTENDED_YEAR field; but since
        //   we would still need to handle UCAL_YEAR_WOY as below, might as well
        //   also handle UCAL_YEAR the same way.
        int32_t era = get(UCAL_ERA, status);
        if (era == 0) {
          const char * calType = getType();
          if ( uprv_strcmp(calType,"gregorian")==0 || uprv_strcmp(calType,"roc")==0 || uprv_strcmp(calType,"coptic")==0 ) {
            amount = -amount;
          }
        }
      }
      // Fall through into normal handling
      U_FALLTHROUGH;
    case UCAL_EXTENDED_YEAR:
    case UCAL_MONTH:
      {
        UBool oldLenient = isLenient();
        setLenient(TRUE);
        set(field, get(field, status) + amount);
        pinField(UCAL_DAY_OF_MONTH, status);
        if(oldLenient==FALSE) {
          complete(status); /* force recalculate */
          setLenient(oldLenient);
        }
      }
      return;

    case UCAL_WEEK_OF_YEAR:
    case UCAL_WEEK_OF_MONTH:
    case UCAL_DAY_OF_WEEK_IN_MONTH:
        delta *= kOneWeek;
        break;

    case UCAL_AM_PM:
        delta *= 12 * kOneHour;
        break;

    case UCAL_DAY_OF_MONTH:
    case UCAL_DAY_OF_YEAR:
    case UCAL_DAY_OF_WEEK:
    case UCAL_DOW_LOCAL:
    case UCAL_JULIAN_DAY:
        delta *= kOneDay;
        break;

    case UCAL_HOUR_OF_DAY:
    case UCAL_HOUR:
        delta *= kOneHour;
        keepWallTimeInvariant = FALSE;
        break;

    case UCAL_MINUTE:
        delta *= kOneMinute;
        keepWallTimeInvariant = FALSE;
        break;

    case UCAL_SECOND:
        delta *= kOneSecond;
        keepWallTimeInvariant = FALSE;
        break;

    case UCAL_MILLISECOND:
    case UCAL_MILLISECONDS_IN_DAY:
        keepWallTimeInvariant = FALSE;
        break;

    default:
#if defined (U_DEBUG_CAL)
        fprintf(stderr, "%s:%d: ILLEGAL ARG because field %s not addable",
            __FILE__, __LINE__, fldName(field));
#endif
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
        //  throw new IllegalArgumentException("Calendar.add(" + fieldName(field) +
        //                                     ") not supported");
    }

    // In order to keep the wall time invariant (for fields where this is
    // appropriate), check the combined DST & ZONE offset before and
    // after the add() operation. If it changes, then adjust the millis
    // to compensate.
    int32_t prevOffset = 0;
    int32_t prevWallTime = 0;
    if (keepWallTimeInvariant) {
        prevOffset = get(UCAL_DST_OFFSET, status) + get(UCAL_ZONE_OFFSET, status);
        prevWallTime = get(UCAL_MILLISECONDS_IN_DAY, status);
    }

    setTimeInMillis(getTimeInMillis(status) + delta, status);

    if (keepWallTimeInvariant) {
        int32_t newWallTime = get(UCAL_MILLISECONDS_IN_DAY, status);
        if (newWallTime != prevWallTime) {
            // There is at least one zone transition between the base
            // time and the result time. As the result, wall time has
            // changed.
            UDate t = internalGetTime();
            int32_t newOffset = get(UCAL_DST_OFFSET, status) + get(UCAL_ZONE_OFFSET, status);
            if (newOffset != prevOffset) {
                // When the difference of the previous UTC offset and
                // the new UTC offset exceeds 1 full day, we do not want
                // to roll over/back the date. For now, this only happens
                // in Samoa (Pacific/Apia) on Dec 30, 2011. See ticket:9452.
                int32_t adjAmount = prevOffset - newOffset;
                adjAmount = adjAmount >= 0 ? adjAmount % (int32_t)kOneDay : -(-adjAmount % (int32_t)kOneDay);
                if (adjAmount != 0) {
                    setTimeInMillis(t + adjAmount, status);
                    newWallTime = get(UCAL_MILLISECONDS_IN_DAY, status);
                }
                if (newWallTime != prevWallTime) {
                    // The result wall time or adjusted wall time was shifted because
                    // the target wall time does not exist on the result date.
                    switch (fSkippedWallTime) {
                    case UCAL_WALLTIME_FIRST:
                        if (adjAmount > 0) {
                            setTimeInMillis(t, status);
                        }
                        break;
                    case UCAL_WALLTIME_LAST:
                        if (adjAmount < 0) {
                            setTimeInMillis(t, status);
                        }
                        break;
                    case UCAL_WALLTIME_NEXT_VALID:
                        UDate tmpT = adjAmount > 0 ? internalGetTime() : t;
                        UDate immediatePrevTrans;
                        UBool hasTransition = getImmediatePreviousZoneTransition(tmpT, &immediatePrevTrans, status);
                        if (U_SUCCESS(status) && hasTransition) {
                            setTimeInMillis(immediatePrevTrans, status);
                        }
                        break;
                    }
                }
            }
        }
    }
}